

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O3

bool __thiscall
cmLoadedCommand::InitialPass
          (cmLoadedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  int iVar1;
  char **argv;
  char *pcVar2;
  ulong uVar3;
  pointer pbVar4;
  uint argc;
  cmLoadedCommandInfo *pcVar5;
  bool bVar6;
  allocator local_59;
  cmLoadedCommandInfo *local_58;
  string local_50;
  
  if ((this->info).InitialPass == (CM_INITIAL_PASS_FUNCTION)0x0) {
    bVar6 = true;
  }
  else {
    pcVar2 = (this->info).Error;
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
    }
    pcVar5 = &this->info;
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
    argc = (uint)(uVar3 >> 5);
    if (argc == 0) {
      argv = (char **)0x0;
    }
    else {
      argv = (char **)malloc((long)(uVar3 * 0x8000000) >> 0x1d);
      if (0 < (int)argc) {
        uVar3 = 0;
        local_58 = pcVar5;
        do {
          pcVar2 = strdup((pbVar4->_M_dataplus)._M_p);
          argv[uVar3] = pcVar2;
          uVar3 = uVar3 + 1;
          pbVar4 = pbVar4 + 1;
          pcVar5 = local_58;
        } while ((argc & 0x7fffffff) != uVar3);
      }
    }
    InstallSignalHandlers((this->info).Name,0);
    iVar1 = (*(this->info).InitialPass)(pcVar5,(this->super_cmCommand).Makefile,argc,argv);
    InstallSignalHandlers((this->info).Name,1);
    cmFreeArguments(argc,argv);
    bVar6 = iVar1 != 0;
    pcVar2 = (this->info).Error;
    if (pcVar2 != (char *)0x0 && !bVar6) {
      std::__cxx11::string::string((string *)&local_50,pcVar2,&local_59);
      cmCommand::SetError(&this->super_cmCommand,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool cmLoadedCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus &)
{
  if (!info.InitialPass)
    {
    return true;
    }

  // clear the error string
  if (this->info.Error)
    {
    free(this->info.Error);
    }

  // create argc and argv and then invoke the command
  int argc = static_cast<int> (args.size());
  char **argv = 0;
  if (argc)
    {
    argv = (char **)malloc(argc*sizeof(char *));
    }
  int i;
  for (i = 0; i < argc; ++i)
    {
    argv[i] = strdup(args[i].c_str());
    }
  cmLoadedCommand::InstallSignalHandlers(info.Name);
  int result = info.InitialPass((void *)&info,
                                (void *)this->Makefile,argc,argv);
  cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
  cmFreeArguments(argc,argv);

  if (result)
    {
    return true;
    }

  /* Initial Pass must have failed so set the error string */
  if (this->info.Error)
    {
    this->SetError(this->info.Error);
    }
  return false;
}